

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpolationBase.test.cpp
# Opt level: O2

void verifyChunk(InterpolationBase *chunk)

{
  long lVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  char *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0 [2];
  AssertionHandler catchAssertionHandler;
  double local_58;
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x10d;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1c;
  capturedExpression.m_start = "1.0, WithinRel( chunk.C1() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_d8,capturedExpression,
             ContinueOnFailure);
  local_58 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
             .super__Head_base<0UL,_double,_false>._M_head_impl);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_58);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c8370;
  local_40 = &local_58;
  local_38 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x10e;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x1c;
  capturedExpression_00.m_start = "2.0, WithinRel( chunk.C2() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_d8,capturedExpression_00,
             ContinueOnFailure);
  local_58 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d8,
             (chunk->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>
             .super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d8,&local_58);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c8370;
  local_40 = &local_58;
  local_38 = (WithinRelMatcher *)local_d8;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x10f;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "3 == chunk.L1()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_d8,capturedExpression_01,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_d0._1_1_ = local_c0[0]._8_8_ == 3;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 3;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x110;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0xf;
  capturedExpression_02.m_start = "4 == chunk.L2()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_d8,capturedExpression_02,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->metadata).fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_d0._1_1_ = local_c0[0]._8_8_ == 4;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x112;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "8 == chunk.N2()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_d8,capturedExpression_03,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish[-1];
  local_d0._1_1_ = local_c0[0]._8_8_ == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 8;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x113;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0xf;
  capturedExpression_04.m_start = "4 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_04,(SourceLineInfo *)local_d8,capturedExpression_04,
             ContinueOnFailure);
  lVar1 = (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x114;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x27;
  capturedExpression_05.m_start = "4 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_05,(SourceLineInfo *)local_d8,capturedExpression_05,
             ContinueOnFailure);
  lVar1 = (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x116;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x17;
  capturedExpression_06.m_start = "4 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_06,(SourceLineInfo *)local_d8,capturedExpression_06,
             ContinueOnFailure);
  lVar1 = (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x117;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x17;
  capturedExpression_07.m_start = "4 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_07,(SourceLineInfo *)local_d8,capturedExpression_07,
             ContinueOnFailure);
  lVar1 = (long)(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x118;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x13;
  capturedExpression_08.m_start = "4 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_08,(SourceLineInfo *)local_d8,capturedExpression_08,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 4;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x119;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x13;
  capturedExpression_09.m_start = "5 == chunk.NBT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_09,(SourceLineInfo *)local_d8,capturedExpression_09,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_d0._1_1_ = local_c0[0]._8_8_ == 5;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 5;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11a;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x13;
  capturedExpression_10.m_start = "6 == chunk.NBT()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_10,(SourceLineInfo *)local_d8,capturedExpression_10,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_d0._1_1_ = local_c0[0]._8_8_ == 6;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11b;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x13;
  capturedExpression_11.m_start = "8 == chunk.NBT()[3]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_11,(SourceLineInfo *)local_d8,capturedExpression_11,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[3];
  local_d0._1_1_ = local_c0[0]._8_8_ == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 8;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11c;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x13;
  capturedExpression_12.m_start = "1 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_12,(SourceLineInfo *)local_d8,capturedExpression_12,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 1;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11d;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x13;
  capturedExpression_13.m_start = "2 == chunk.INT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_13,(SourceLineInfo *)local_d8,capturedExpression_13,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_d0._1_1_ = local_c0[0]._8_8_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11e;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x13;
  capturedExpression_14.m_start = "3 == chunk.INT()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_14,(SourceLineInfo *)local_d8,capturedExpression_14,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_d0._1_1_ = local_c0[0]._8_8_ == 3;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 3;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x11f;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x13;
  capturedExpression_15.m_start = "5 == chunk.INT()[3]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_15,(SourceLineInfo *)local_d8,capturedExpression_15,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[3];
  local_d0._1_1_ = local_c0[0]._8_8_ == 5;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 5;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x121;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x1e;
  capturedExpression_16.m_start = "4 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_16,(SourceLineInfo *)local_d8,capturedExpression_16,
             ContinueOnFailure);
  lVar1 = (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x122;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x20;
  capturedExpression_17.m_start = "4 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_17,(SourceLineInfo *)local_d8,capturedExpression_17,
             ContinueOnFailure);
  lVar1 = (long)(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_c0[0]._8_8_ = lVar1 >> 3;
  local_d0._1_1_ = lVar1 == 0x20;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83f0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x123;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x1a;
  capturedExpression_18.m_start = "4 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_18,(SourceLineInfo *)local_d8,capturedExpression_18,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 4;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 4;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x124;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x1a;
  capturedExpression_19.m_start = "5 == chunk.boundaries()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_19,(SourceLineInfo *)local_d8,capturedExpression_19,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_d0._1_1_ = local_c0[0]._8_8_ == 5;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 5;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x125;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x1a;
  capturedExpression_20.m_start = "6 == chunk.boundaries()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_20,(SourceLineInfo *)local_d8,capturedExpression_20,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_d0._1_1_ = local_c0[0]._8_8_ == 6;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 6;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x126;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x1a;
  capturedExpression_21.m_start = "8 == chunk.boundaries()[3]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_21,(SourceLineInfo *)local_d8,capturedExpression_21,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[3];
  local_d0._1_1_ = local_c0[0]._8_8_ == 8;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 8;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x127;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x1c;
  capturedExpression_22.m_start = "1 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_22,(SourceLineInfo *)local_d8,capturedExpression_22,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       *(chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_d0._1_1_ = local_c0[0]._8_8_ == 1;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 1;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x128;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x1c;
  capturedExpression_23.m_start = "2 == chunk.interpolants()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_23,(SourceLineInfo *)local_d8,capturedExpression_23,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[1];
  local_d0._1_1_ = local_c0[0]._8_8_ == 2;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 2;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x129;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x1c;
  capturedExpression_24.m_start = "3 == chunk.interpolants()[2]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_24,(SourceLineInfo *)local_d8,capturedExpression_24,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[2];
  local_d0._1_1_ = local_c0[0]._8_8_ == 3;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 3;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x12a;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x1c;
  capturedExpression_25.m_start = "5 == chunk.interpolants()[3]";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_25,(SourceLineInfo *)local_d8,capturedExpression_25,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (chunk->interpolationSchemeIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start[3];
  local_d0._1_1_ = local_c0[0]._8_8_ == 5;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 5;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_d8 = (undefined1  [8])0x17d478;
  local_d0 = (pointer)0x12c;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0xf;
  capturedExpression_26.m_start = "3 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_26,(SourceLineInfo *)local_d8,capturedExpression_26,
             ContinueOnFailure);
  local_c0[0]._8_8_ =
       (((long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(chunk->boundaryIndices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) + 2) / 3 + 1;
  local_d0._1_1_ = local_c0[0]._8_8_ == 3;
  local_d0._0_1_ = true;
  local_d8 = (undefined1  [8])&PTR_streamReconstructedExpression_001c83b0;
  local_d0._4_4_ = 3;
  local_c8 = "==";
  local_c0[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_d8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void verifyChunk( const InterpolationBase& chunk ) {

  CHECK_THAT( 1.0, WithinRel( chunk.C1() ) );
  CHECK_THAT( 2.0, WithinRel( chunk.C2() ) );
  CHECK( 3 == chunk.L1() );
  CHECK( 4 == chunk.L2() );

  CHECK( 8 == chunk.N2() );
  CHECK( 4 == chunk.NR() );
  CHECK( 4 == chunk.numberInterpolationRegions() );

  CHECK( 4 == chunk.NBT().size() );
  CHECK( 4 == chunk.INT().size() );
  CHECK( 4 == chunk.NBT()[0] );
  CHECK( 5 == chunk.NBT()[1] );
  CHECK( 6 == chunk.NBT()[2] );
  CHECK( 8 == chunk.NBT()[3] );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.INT()[1] );
  CHECK( 3 == chunk.INT()[2] );
  CHECK( 5 == chunk.INT()[3] );

  CHECK( 4 == chunk.boundaries().size() );
  CHECK( 4 == chunk.interpolants().size() );
  CHECK( 4 == chunk.boundaries()[0] );
  CHECK( 5 == chunk.boundaries()[1] );
  CHECK( 6 == chunk.boundaries()[2] );
  CHECK( 8 == chunk.boundaries()[3] );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.interpolants()[1] );
  CHECK( 3 == chunk.interpolants()[2] );
  CHECK( 5 == chunk.interpolants()[3] );

  CHECK( 3 == chunk.NC() );
}